

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlkq.cpp
# Opt level: O1

void __thiscall pg::ZLKQSolver::solve(ZLKQSolver *this,bitset *SG,int vtop,int pe,int po)

{
  ulong *puVar1;
  uint uVar2;
  int iVar3;
  uint64_t *puVar4;
  uint *puVar5;
  Game *pGVar6;
  int *piVar7;
  char cVar8;
  ostream *poVar9;
  long *plVar10;
  size_t sVar11;
  uint64_t *puVar12;
  size_t sVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  uint po_00;
  uint uVar17;
  int *piVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  bool bVar24;
  bitset R;
  bitset H;
  bool local_b4;
  _label_vertex local_a8;
  uint local_98;
  uint local_94;
  bitset *local_90;
  uint local_84;
  bitset *local_80;
  bitset local_78;
  bitset local_58;
  ulong local_38;
  
  uVar22 = (ulong)(uint)vtop;
  this->iterations = this->iterations + 1;
  if (po < 1) {
    sVar11 = (this->W0)._bitssize;
    if (sVar11 != 0) {
      puVar12 = SG->_bits;
      puVar4 = (this->W0)._bits;
      sVar13 = 0;
      do {
        puVar1 = puVar4 + sVar13;
        *puVar1 = *puVar1 | puVar12[sVar13];
        sVar13 = sVar13 + 1;
      } while (sVar11 != sVar13);
    }
    if ((this->super_Solver).trace == 0) {
      return;
    }
    sVar11 = 0;
    do {
      sVar13 = sVar11;
      if (SG->_bitssize == sVar13) {
        return;
      }
      sVar11 = sVar13 + 1;
    } while (SG->_bits[sVar13] == 0);
    if (SG->_bitssize == sVar13) {
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->super_Solver).logger,"End of precision; presumed won by player 0:",0x2b);
    if (-1 < vtop) {
      do {
        if ((SG->_bits[uVar22 >> 6] >> (uVar22 & 0x3f) & 1) != 0) {
          poVar9 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," \x1b[38;5;38m",0xb);
          local_78._bits = (uint64_t *)(this->super_Solver).game;
          local_78._size = CONCAT44(local_78._size._4_4_,(int)uVar22);
          poVar9 = operator<<(poVar9,(_label_vertex *)&local_78);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m",3);
        }
        bVar24 = 0 < (long)uVar22;
        uVar22 = uVar22 - 1;
      } while (bVar24);
    }
  }
  else {
    if (0 < pe) {
      if (-1 < vtop) {
        do {
          iVar21 = (int)uVar22;
          if ((SG->_bits[uVar22 >> 6] >> (uVar22 & 0x3f) & 1) != 0) goto LAB_0014d58c;
          uVar22 = (ulong)(iVar21 - 1);
        } while (0 < iVar21);
        uVar22 = 0xffffffff;
      }
LAB_0014d58c:
      iVar21 = (int)uVar22;
      if (iVar21 == -1) {
        return;
      }
      uVar2 = ((this->super_Solver).game)->_priority[iVar21];
      if ((uVar2 & 1) == 0) {
        uVar20 = pe;
        uVar17 = (uint)po >> 1;
      }
      else {
        uVar20 = (uint)pe >> 1;
        uVar17 = po;
      }
      solve(this,SG,iVar21,uVar20,uVar17);
      uVar20 = uVar2 & 1;
      if (1 < (this->super_Solver).trace) {
        poVar9 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"in pr=",6);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,", pe=",5);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,pe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,", po=",5);
        plVar10 = (long *)std::ostream::operator<<(poVar9,po);
        std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
        std::ostream::put((char)plVar10);
        std::ostream::flush();
      }
      sVar11 = bitset::count(SG);
      uVar17 = pe;
      if (uVar20 == 0) {
        uVar17 = po;
      }
      if (sVar11 <= uVar17 >> 1) {
        return;
      }
      local_80 = &this->W0;
      local_90 = &this->W1;
      if (uVar20 == 0) {
        local_80 = &this->W1;
        local_90 = &this->W0;
      }
      local_78._size = SG->_size;
      uVar23 = SG->_bitssize;
      uVar14 = uVar23 * 8;
      local_98 = pe;
      local_94 = po;
      local_78._bitssize = uVar23;
      local_78._allocsize = uVar14;
      puVar12 = (uint64_t *)operator_new__(-(ulong)(uVar23 >> 0x3d != 0) | uVar14);
      local_78._bits = puVar12;
      if (uVar23 != 0) {
        memmove(puVar12,SG->_bits,uVar14);
        puVar4 = local_90->_bits;
        uVar14 = 0;
        do {
          puVar12[uVar14] = puVar12[uVar14] & puVar4[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar23 != uVar14);
      }
      if (-1 < iVar21) {
        do {
          iVar21 = (int)uVar22;
          if ((puVar12[uVar22 >> 6] >> (uVar22 & 0x3f) & 1) != 0) goto LAB_0014d983;
          uVar22 = (ulong)(iVar21 - 1);
        } while (0 < iVar21);
        uVar22 = 0xffffffff;
      }
LAB_0014d983:
      iVar21 = (int)uVar22;
      if (iVar21 != -1) {
        local_58._size = ((this->super_Solver).game)->n_vertices;
        uVar14 = local_58._size + 0x3f;
        local_58._bitssize = uVar14 >> 6;
        uVar23 = local_58._bitssize << 3;
        local_58._allocsize = uVar23;
        local_58._bits = (uint64_t *)operator_new__(uVar23);
        local_38 = (ulong)(uVar20 << 5);
        if (0x3f < uVar14) {
          memset(local_58._bits,0,uVar23);
        }
        local_38 = local_38 + 0x50;
        uVar14 = (ulong)iVar21;
        do {
          if ((((this->super_Solver).game)->_priority[uVar14] & 1U) != uVar20) break;
          if ((local_78._bits[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0) {
            local_58._bits[uVar14 >> 6] = local_58._bits[uVar14 >> 6] | 1L << (uVar14 & 0x3f);
            this->str[uVar14] = -1;
            iVar3 = (this->Q).pointer;
            (this->Q).pointer = iVar3 + 1;
            (this->Q).queue[iVar3] = (uint)uVar14;
            while( true ) {
              iVar3 = (this->Q).pointer;
              if ((long)iVar3 == 0) break;
              (this->Q).pointer = iVar3 + -1;
              attractVertices(this,uVar20,(this->Q).queue[(long)iVar3 + -1],&local_58,&local_78,
                              &local_78);
            }
          }
          bVar24 = uVar14 != 0;
          uVar14 = uVar14 - 1;
        } while (bVar24);
        po_00 = local_94;
        uVar17 = local_98;
        if ((this->super_Solver).trace != 0) {
          poVar9 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"\x1b[1;33mregion \x1b[36m",0x13);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m",3);
          sVar11 = 0xffffffffffffffff;
          if (local_58._bitssize != 0) {
            lVar15 = local_58._bitssize * -0x40;
            sVar13 = local_58._bitssize;
            do {
              lVar15 = lVar15 + 0x40;
              if (local_58._bits[sVar13 - 1] != 0) {
                sVar11 = LZCOUNT(local_58._bits[sVar13 - 1]) - lVar15 ^ 0x3f;
                break;
              }
              sVar13 = sVar13 - 1;
            } while (sVar13 != 0);
          }
          if (sVar11 != 0xffffffffffffffff) {
            do {
              poVar9 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," \x1b[38;5;38m",0xb);
              local_a8.g = (this->super_Solver).game;
              local_a8.v = (int)sVar11;
              poVar9 = operator<<(poVar9,&local_a8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m",3);
              sVar11 = bitset::find_prev(&local_58,sVar11);
            } while (sVar11 != 0xffffffffffffffff);
          }
          poVar9 = (this->super_Solver).logger;
          cVar8 = (char)poVar9;
          std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + cVar8);
          po_00 = local_94;
          uVar17 = local_98;
          std::ostream::put(cVar8);
          std::ostream::flush();
        }
        sVar11 = local_80->_bitssize;
        if (sVar11 != 0) {
          puVar12 = local_80->_bits;
          sVar13 = 0;
          do {
            puVar12[sVar13] = puVar12[sVar13] & ~local_78._bits[sVar13];
            sVar13 = sVar13 + 1;
          } while (sVar11 != sVar13);
        }
        sVar11 = local_90->_bitssize;
        if (sVar11 != 0) {
          puVar12 = local_90->_bits;
          sVar13 = 0;
          do {
            puVar12[sVar13] = puVar12[sVar13] & ~local_78._bits[sVar13];
            sVar13 = sVar13 + 1;
          } while (sVar11 != sVar13);
        }
        sVar11 = local_90->_bitssize;
        if (sVar11 != 0) {
          puVar12 = local_90->_bits;
          sVar13 = 0;
          do {
            puVar12[sVar13] = puVar12[sVar13] | local_58._bits[sVar13];
            sVar13 = sVar13 + 1;
          } while (sVar11 != sVar13);
        }
        if (local_58._bitssize != 0) {
          uVar14 = 0;
          do {
            local_58._bits[uVar14] = local_58._bits[uVar14] ^ local_78._bits[uVar14];
            uVar14 = uVar14 + 1;
          } while (local_58._bitssize != uVar14);
        }
        solve(this,&local_58,iVar21,uVar17,po_00);
        if (-1 < iVar21) {
          puVar5 = (this->Q).queue;
          uVar14 = 0;
          do {
            if (((local_58._bits[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0) &&
               ((local_80->_bits[uVar14 >> 6] & 1L << (uVar14 & 0x3f)) != 0)) {
              iVar3 = (this->Q).pointer;
              (this->Q).pointer = iVar3 + 1;
              puVar5[iVar3] = (uint)uVar14;
            }
            uVar14 = uVar14 + 1;
          } while (iVar21 + 1 != uVar14);
        }
        if ((this->Q).pointer == 0) {
          local_84 = 0;
        }
        else {
          local_84 = 0;
          while( true ) {
            iVar3 = (this->Q).pointer;
            po_00 = local_94;
            uVar17 = local_98;
            if ((long)iVar3 == 0) break;
            (this->Q).pointer = iVar3 + -1;
            uVar19 = (this->Q).queue[(long)iVar3 + -1];
            uVar23 = (ulong)(int)uVar19;
            uVar14 = *(ulong *)(*(long *)((long)&(this->super_Solver)._vptr_Solver + local_38) +
                               (uVar23 >> 6) * 8);
            if ((((uVar14 >> (uVar23 & 0x3f) & 1) != 0) &&
                (local_84 = (uint)CONCAT71((int7)(uVar14 >> 8),1), (this->super_Solver).trace != 0))
               && (((this->super_Solver).game)->_priority[uVar23] == uVar2)) {
              poVar9 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,"\x1b[1;37mfound distraction\x1b[m: ",0x1d);
              local_a8.g = (this->super_Solver).game;
              local_a8.v = uVar19;
              poVar9 = operator<<(poVar9,&local_a8);
              std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
              std::ostream::put((char)poVar9);
              std::ostream::flush();
            }
            attractVertices(this,uVar20 ^ 1,uVar19,local_80,&local_78,&local_78);
          }
        }
        if (1 < (this->super_Solver).trace) {
          poVar9 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Subgame of (",0xc);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," pe=",4);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar17);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," po=",4);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,po_00);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"):",2);
          uVar14 = uVar22;
          if (-1 < iVar21) {
            do {
              uVar23 = uVar14 >> 6;
              if ((SG->_bits[uVar23] >> (uVar14 & 0x3f) & 1) != 0) {
                uVar16 = 1L << (uVar14 & 0x3f);
                uVar19 = (uint)uVar14;
                if ((local_78._bits[uVar23] & uVar16) == 0) {
                  poVar9 = (this->super_Solver).logger;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9," \x1b[38;5;160m",0xc);
                  local_a8.g = (this->super_Solver).game;
                  local_a8.v = uVar19;
                  poVar9 = operator<<(poVar9,&local_a8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m",3);
                }
                else if ((local_90->_bits[uVar23] & uVar16) == 0) {
                  poVar9 = (this->super_Solver).logger;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9," \x1b[1;38;5;196m",0xe)
                  ;
                  local_a8.g = (this->super_Solver).game;
                  local_a8.v = uVar19;
                  poVar9 = operator<<(poVar9,&local_a8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m",3);
                }
                else if ((local_80->_bits[uVar23] & uVar16) == 0) {
                  poVar9 = (this->super_Solver).logger;
                  if ((local_58._bits[uVar23] & uVar16) == 0) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar9," \x1b[1;38;5;46m",0xd);
                    local_a8.g = (this->super_Solver).game;
                    local_a8.v = uVar19;
                    poVar9 = operator<<(poVar9,&local_a8);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m",3);
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>(poVar9," \x1b[38;5;38m",0xb);
                    local_a8.g = (this->super_Solver).game;
                    local_a8.v = uVar19;
                    poVar9 = operator<<(poVar9,&local_a8);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m",3);
                  }
                }
                else {
                  poVar9 = (this->super_Solver).logger;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9," \x1b[38;5;202m",0xc);
                  local_a8.g = (this->super_Solver).game;
                  local_a8.v = uVar19;
                  poVar9 = operator<<(poVar9,&local_a8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m",3);
                }
              }
              bVar24 = 0 < (long)uVar14;
              uVar14 = uVar14 - 1;
            } while (bVar24);
          }
          poVar9 = (this->super_Solver).logger;
          cVar8 = (char)poVar9;
          std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + cVar8);
          po_00 = local_94;
          uVar17 = local_98;
          std::ostream::put(cVar8);
          std::ostream::flush();
        }
        if ((local_84 & 1) == 0) {
          if (-1 < iVar21) {
            pGVar6 = (this->super_Solver).game;
            piVar7 = this->str;
            local_b4 = (bool)((byte)uVar2 & 1);
            do {
              uVar14 = uVar22 >> 6;
              if (((((local_78._bits[uVar14] >> (uVar22 & 0x3f) & 1) != 0) &&
                   ((local_90->_bits[uVar14] & 1L << (uVar22 & 0x3f)) != 0)) &&
                  ((((pGVar6->_owner)._bits[uVar14] >> (uVar22 & 0x3f) & 1) == 0) != local_b4)) &&
                 (piVar7[uVar22] == -1)) {
                iVar21 = pGVar6->_outedges[pGVar6->_firstouts[uVar22]];
                if (iVar21 != -1) {
                  piVar18 = pGVar6->_outedges + (long)pGVar6->_firstouts[uVar22] + 1;
                  do {
                    if ((local_90->_bits[(ulong)(long)iVar21 >> 6] >> ((long)iVar21 & 0x3fU) & 1) !=
                        0) {
                      piVar7[uVar22] = iVar21;
                      break;
                    }
                    iVar21 = *piVar18;
                    piVar18 = piVar18 + 1;
                  } while (iVar21 != -1);
                }
              }
              bVar24 = 0 < (long)uVar22;
              uVar22 = uVar22 - 1;
            } while (bVar24);
          }
        }
        else {
          sVar11 = local_90->_bitssize;
          if (sVar11 != 0) {
            puVar12 = local_90->_bits;
            sVar13 = 0;
            do {
              puVar12[sVar13] = puVar12[sVar13] & ~local_78._bits[sVar13];
              sVar13 = sVar13 + 1;
            } while (sVar11 != sVar13);
          }
          if (local_78._bitssize != 0) {
            puVar12 = local_80->_bits;
            uVar14 = 0;
            do {
              local_78._bits[uVar14] = local_78._bits[uVar14] & ~puVar12[uVar14];
              uVar14 = uVar14 + 1;
            } while (local_78._bitssize != uVar14);
          }
          if (-1 < iVar21) {
            do {
              iVar21 = (int)uVar22;
              if ((local_78._bits[uVar22 >> 6] >> (uVar22 & 0x3f) & 1) != 0) goto LAB_0014e106;
              uVar22 = (ulong)(iVar21 - 1);
            } while (0 < iVar21);
            iVar21 = -1;
          }
LAB_0014e106:
          if (iVar21 != -1) {
            solve(this,&local_78,iVar21,uVar17 >> uVar20,po_00 >> ((byte)uVar20 ^ 1));
          }
        }
        if (local_58._bits != (uint64_t *)0x0) {
          operator_delete__(local_58._bits);
        }
      }
      if (local_78._bits == (uint64_t *)0x0) {
        return;
      }
      operator_delete__(local_78._bits);
      return;
    }
    sVar11 = (this->W1)._bitssize;
    if (sVar11 != 0) {
      puVar12 = SG->_bits;
      puVar4 = (this->W1)._bits;
      sVar13 = 0;
      do {
        puVar1 = puVar4 + sVar13;
        *puVar1 = *puVar1 | puVar12[sVar13];
        sVar13 = sVar13 + 1;
      } while (sVar11 != sVar13);
    }
    if ((this->super_Solver).trace == 0) {
      return;
    }
    sVar11 = 0;
    do {
      sVar13 = sVar11;
      if (SG->_bitssize == sVar13) {
        return;
      }
      sVar11 = sVar13 + 1;
    } while (SG->_bits[sVar13] == 0);
    if (SG->_bitssize == sVar13) {
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->super_Solver).logger,"End of precision; presumed won by player 1:",0x2b);
    if (-1 < vtop) {
      do {
        if ((SG->_bits[uVar22 >> 6] >> (uVar22 & 0x3f) & 1) != 0) {
          poVar9 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," \x1b[38;5;38m",0xb);
          local_78._bits = (uint64_t *)(this->super_Solver).game;
          local_78._size = CONCAT44(local_78._size._4_4_,(int)uVar22);
          poVar9 = operator<<(poVar9,(_label_vertex *)&local_78);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m",3);
        }
        bVar24 = 0 < (long)uVar22;
        uVar22 = uVar22 - 1;
      } while (bVar24);
    }
  }
  poVar9 = (this->super_Solver).logger;
  cVar8 = (char)poVar9;
  std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + cVar8);
  std::ostream::put(cVar8);
  std::ostream::flush();
  return;
}

Assistant:

void
ZLKQSolver::solve(bitset &SG, int vtop, const int pe, const int po)
{
    /**
     * This is based on a universal tree of height pr/2, with parameter n associated with pe or po
     * We use several implementation tricks to make optimal use of memory and allocate as few as possible
     * For example, we record partial winning sets for Even and Odd in W0 and W1, because all partial
     * winning sets between calls are disjoint (so, safe to share the same bit array)
     */

    /**
     * Record the number of recursive calls (visits)
     */

    iterations++;

    /**
     * Check if we have run out of precision / nodes! (parameter n)
     * If our opponent's precision is gone, assume it's all won by us.
     * If our own precision is gone, assume it's all won by the opponent.
     */

    if (po <= 0) {
        W0 |= SG;

#ifndef NDEBUG
        if (trace and SG.any()) {
            logger << "End of precision; presumed won by player 0:";
            for (int v=vtop; v>=0; v--) {
                if (SG[v]) {
                    logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
                }
            }
            logger << std::endl;
        }
#endif

        return;
    }

    if (pe <= 0) {
        W1 |= SG;

#ifndef NDEBUG
        if (trace and SG.any()) {
            logger << "End of precision; presumed won by player 1:";
            for (int v=vtop; v>=0; v--) {
                if (SG[v]) {
                    logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
                }
            }
            logger << std::endl;
        }
#endif

        return;
    }

    /**
     * Move <vtop> to the true top (highest vertex that is in SG)
     */

    while (vtop >= 0 and !SG[vtop]) vtop--;

    /**
     * Check if the game is empty
     */
    if (vtop == -1) return; // empty game, bye

    /**
     * Optimization: set pr/pl to top priority/player
     * This is like taking a shortcut in the Tree
     */

    const int pr = priority(vtop);
    const int pl = pr&1;

    /**
     * Expand the left side of the current level of the universal tree
     */

    if (pl == 0) {
        solve(SG, vtop, pe, po/2);
    } else {
        solve(SG, vtop, pe/2, po);
    }

#ifndef NDEBUG
    if (trace >= 2) logger << "in pr=" << pr << ", pe=" << pe << ", po=" << po << std::endl;
#endif

    /**
     * If the remaining subgame size <= po/2 cq pe/2 then we don't need to continue after the recursion.
     *   (this optimization is due to Lehtinen, Parys, Schewe, Wojtczak '21)
     */

    if (pl == 0) {
        if (SG.count() <= (unsigned long)(po/2)) return;
    } else {
        if (SG.count() <= (unsigned long)(pe/2)) return;
    }

    auto &Wm = pl == 0 ? W0 : W1; // my W
    auto &Wo = pl == 0 ? W1 : W0; // opponent's W

    /**
     * Now compute <R> := vertices in subgame that we won in the left side
     * That is, the intersection of SG and Wm.
     *
     * Consider R to be the game that remains after the steps on the left in the universal tree.
     * Fmore, SG is immutable, R is a local bitset
     */

    bitset R(SG);
    R &= Wm;

    /**
     * Update vtop to the highest vertex in the intersection
     */
    while (vtop >= 0 and !R[vtop]) vtop--;
    if (vtop == -1) return;

    /**
     * Compute H := Attr(vertices of <pr> in <R>)
     */
    bitset H(nodecount());

    for (int v=vtop; v!=-1; v--) {
        // if (priority(v) != pr) break; // stop attracting ... ;) [todo: add otf compression ?]
        if ((priority(v)&1) != pl) break; // on-the-fly compression
        if (R[v]) {
            H[v] = true;
            str[v] = -1;
            Q.push(v);
            while (Q.nonempty()) {
                attractVertices(pl, Q.pop(), H, R, R);
            }
        }
    }

#ifndef NDEBUG
    if (trace) {
        logger << "\033[1;33mregion \033[36m" << pr << "\033[m";
        for (auto v = H.find_last(); v != bitset::npos; v = H.find_prev(v)) {
            logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
        }
        logger << std::endl;
    }
#endif

    /**
     * Reset Wo and Wm for vertices in <R> - <H>;
     * Set H to the remaining subgame (G' in the universal paper)
     */

    // reset opponent and our region
    Wo -= R;
    Wm -= R;
    // but set everything in H to ours
    Wm |= H;
    // and set H := R - H
    H ^= R;

    /**
     * Go recursive!
     */
    solve(H, vtop, pe, po);

    /**
     * Let the opponent attract from our region...
     * The intersection of H and Wo is the opponent's subgame
     */
    bool opponent_attracted_from_us = false;
    for (int v=0; v<=vtop; v++) {
        if (H[v] and Wo[v]) Q.push(v);
    }
    if (Q.nonempty()) {
        while (Q.nonempty()) {
            const int v = Q.pop();
            if (Wm[v]) {
#ifndef NDEBUG
                if (trace and priority(v) == pr) {
                    logger << "\033[1;37mfound distraction\033[m: " << label_vertex(v) << std::endl;
                }
#endif
                opponent_attracted_from_us = true;
            }
            attractVertices(1-pl, v, Wo, R, R);
        }
    }

#ifndef NDEBUG
    /**
     * If so desired, report our current status...
     */
    if (trace >= 2) {
        logger << "Subgame of (" << pr << " pe=" << pe << " po=" << po << "):";
        for (int v=vtop; v>=0; v--) {
            if (SG[v]) {
                if (R[v]) {
                    if (Wm[v]) {
                        if (Wo[v]) logger << " \033[38;5;202m" << label_vertex(v) << "\033[m";
                        else if (!H[v]) logger << " \033[1;38;5;46m" << label_vertex(v) << "\033[m";
                        else logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
                    }
                    else logger << " \033[1;38;5;196m" << label_vertex(v) << "\033[m";
                }
                else logger << " \033[38;5;160m" << label_vertex(v) << "\033[m";
            }
        }
        logger << std::endl;
    }
#endif

    /**
     * Finally, if the opponent attracted from us, then we do the right side
     * of the universal tree. Otherwise: update strategies and return.
     * Notice this is also an optimization.
     */
    if (opponent_attracted_from_us) {
        // Reset my winning region <Wm>
        Wm -= R;

        // Reduce subgame by removing opponent's winning region <Wo>
        R -= Wo;

        // Update vtop
        while (vtop >= 0 and !R[vtop]) vtop--;

        // Check if the game is empty
        if (vtop == -1) return; // empty game, bye

        // Expand the right side of the current level of the universal tree
        if (pl == 0) solve(R, vtop, pe, po/2);
        else solve(R, vtop, pe/2, po);
    } else {
        // Set strategy for vertices that do not yet have a strategy
        for (int v=vtop; v>=0; v--) {
            if (R[v] and Wm[v] and owner(v) == pl and str[v] == -1) {
                auto curedge = outs(v);
                for (int to = *curedge; to != -1; to = *++curedge) {
                    if (Wm[to]) {
                        str[v] = to;
                        break;
                    }
                }
            }
        }
    }
}